

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerLdElemI(Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool isHelper)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  IRType IVar4;
  IRType IVar5;
  bool bVar6;
  ObjectType OVar7;
  BailOutKind BVar8;
  int32 iVar9;
  JitProfilingInstr *instr_00;
  LabelInstr *instr_01;
  Opnd *this_00;
  undefined4 *puVar10;
  IndirOpnd *this_01;
  Opnd *this_02;
  IndirOpnd *this_03;
  RegOpnd *pRVar11;
  JnHelperMethod local_84;
  JnHelperMethod local_80;
  Opnd *baseOpnd;
  long lStack_60;
  ValueType baseValueType;
  IntConstType offset;
  Opnd *indexOpnd;
  IRType dstType;
  bool loadScriptContext;
  IndirOpnd *indirOpnd;
  Opnd *src1;
  LabelInstr *labelLdElem;
  Instr *instrPrev;
  bool isHelper_local;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pIVar1 = instr->m_prev;
  bVar3 = IR::Instr::IsJitProfilingInstr(instr);
  if (bVar3) {
    if (helperMethod != HelperOp_GetElementI) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x243f,"(helperMethod == IR::HelperOp_GetElementI)",
                         "helperMethod == IR::HelperOp_GetElementI");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    if (isHelper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2440,"(!isHelper)","!isHelper");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    instr_00 = IR::Instr::AsJitProfilingInstr(instr);
    LowerProfiledLdElemI(this,instr_00);
  }
  else if ((isHelper) || (bVar3 = IR::Instr::DoStackArgsOpt(instr), !bVar3)) {
    this_00 = IR::Instr::UnlinkSrc1(instr);
    bVar3 = IR::Opnd::IsIndirOpnd(this_00);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2453,"(src1->IsIndirOpnd())","Expected indirOpnd");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    this_01 = IR::Opnd::AsIndirOpnd(this_00);
    bVar3 = true;
    this_02 = IR::Instr::GetDst(instr);
    IVar4 = IR::Opnd::GetType(this_02);
    offset = (IntConstType)IR::IndirOpnd::UnlinkIndexOpnd(this_01);
    instrPrev._4_4_ = helperMethod;
    if (((RegOpnd *)offset == (RegOpnd *)0x0) ||
       (IVar5 = IR::Opnd::GetType((Opnd *)offset), IVar5 == TyVar)) {
      if ((RegOpnd *)offset == (RegOpnd *)0x0) {
        this_03 = IR::Opnd::AsIndirOpnd(this_00);
        iVar9 = IR::IndirOpnd::GetOffset(this_03);
        lStack_60 = (long)iVar9;
        offset = (IntConstType)IR::AddrOpnd::NewFromNumber(lStack_60,this->m_func,false);
      }
      if (IVar4 != TyVar) {
        bVar3 = false;
        instrPrev._4_4_ = HelperOp_GetNativeFloatElementI;
        if (IVar4 == TyInt32) {
          instrPrev._4_4_ = HelperOp_GetNativeIntElementI;
        }
      }
    }
    else {
      IVar5 = IR::Opnd::GetType((Opnd *)offset);
      if ((IVar5 != TyUint32) && (IVar5 = IR::Opnd::GetType((Opnd *)offset), IVar5 != TyInt32)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x245b,
                           "(indexOpnd->GetType() == TyUint32 || indexOpnd->GetType() == TyInt32)",
                           "indexOpnd->GetType() == TyUint32 || indexOpnd->GetType() == TyInt32");
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      if (helperMethod == HelperOp_TypeofElem) {
        if (IVar4 != TyVar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2479,"(dstType == TyVar)","dstType == TyVar");
          if (!bVar6) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        IVar4 = IR::Opnd::GetType((Opnd *)offset);
        instrPrev._4_4_ = HelperOp_TypeofElem_Int32;
        if (IVar4 == TyUint32) {
          instrPrev._4_4_ = HelperOp_TypeofElem_UInt32;
        }
      }
      else if (helperMethod == HelperOp_GetElementI) {
        IVar5 = IR::Opnd::GetType((Opnd *)offset);
        if (IVar5 == TyUint32) {
          if (IVar4 == TyVar) {
            local_80 = HelperOp_GetElementI_UInt32;
          }
          else {
            local_80 = HelperOp_GetNativeFloatElementI_UInt32;
            if (IVar4 == TyInt32) {
              local_80 = HelperOp_GetNativeIntElementI_UInt32;
            }
          }
          instrPrev._4_4_ = local_80;
        }
        else {
          if (IVar4 == TyVar) {
            local_84 = HelperOp_GetElementI_Int32;
          }
          else {
            local_84 = HelperOp_GetNativeFloatElementI_Int32;
            if (IVar4 == TyInt32) {
              local_84 = HelperOp_GetNativeIntElementI_Int32;
            }
          }
          instrPrev._4_4_ = local_84;
        }
      }
      else if (helperMethod == HelperOp_GetMethodElement) {
        if (IVar4 != TyVar) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x2472,"(dstType == TyVar)","dstType == TyVar");
          if (!bVar6) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        IVar4 = IR::Opnd::GetType((Opnd *)offset);
        instrPrev._4_4_ = HelperOp_GetMethodElement_Int32;
        if (IVar4 == TyUint32) {
          instrPrev._4_4_ = HelperOp_GetMethodElement_UInt32;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x247f,"(false)","false");
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
    }
    bVar6 = Func::IsLoopBody(this->m_func);
    if (!bVar6) {
      pRVar11 = IR::IndirOpnd::GetBaseOpnd(this_01);
      baseOpnd._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&pRVar11->super_Opnd);
      bVar6 = ValueType::IsLikelyObject((ValueType *)((long)&baseOpnd + 6));
      if (((bVar6) &&
          (OVar7 = ValueType::GetObjectType((ValueType *)((long)&baseOpnd + 6)), OVar7 == Array)) &&
         (bVar6 = ValueType::HasIntElements((ValueType *)((long)&baseOpnd + 6)), !bVar6)) {
        if (instrPrev._4_4_ == HelperOp_GetElementI) {
          bVar6 = ValueType::HasFloatElements((ValueType *)((long)&baseOpnd + 6));
          instrPrev._4_4_ = HelperOp_GetElementI_ExpectingVarArray;
          if (bVar6) {
            instrPrev._4_4_ = HelperOp_GetElementI_ExpectingNativeFloatArray;
          }
        }
        else if (instrPrev._4_4_ == HelperOp_GetElementI_UInt32) {
          bVar6 = ValueType::HasFloatElements((ValueType *)((long)&baseOpnd + 6));
          instrPrev._4_4_ = HelperOp_GetElementI_UInt32_ExpectingVarArray;
          if (bVar6) {
            instrPrev._4_4_ = HelperOp_GetElementI_UInt32_ExpectingNativeFloatArray;
          }
        }
        else if (instrPrev._4_4_ == HelperOp_GetElementI_Int32) {
          bVar6 = ValueType::HasFloatElements((ValueType *)((long)&baseOpnd + 6));
          instrPrev._4_4_ = HelperOp_GetElementI_Int32_ExpectingVarArray;
          if (bVar6) {
            instrPrev._4_4_ = HelperOp_GetElementI_Int32_ExpectingNativeFloatArray;
          }
        }
      }
    }
    if (bVar3) {
      LoadScriptContext(this,instr);
    }
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,(Opnd *)offset);
    pRVar11 = IR::IndirOpnd::UnlinkBaseOpnd(this_01);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&pRVar11->super_Opnd);
    IR::Opnd::Free(this_00,this->m_func);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr,instrPrev._4_4_,(LabelInstr *)0x0,(Opnd *)0x0,
               (PropertySymOpnd *)0x0,isHelper);
  }
  else {
    instr_01 = IR::LabelInstr::New(Label,instr->m_func,false);
    GenerateFastArgumentsLdElemI(this,instr,(LabelInstr *)0x0);
    IR::Instr::InsertBefore(instr,&instr_01->super_Instr);
    IR::Instr::UnlinkSrc1(instr);
    IR::Instr::UnlinkDst(instr);
    bVar3 = IR::Instr::HasBailOutInfo(instr);
    if ((!bVar3) ||
       (BVar8 = IR::Instr::GetBailOutKind(instr), BVar8 != BailOnStackArgsOutOfActualsRange)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x244d,
                         "(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutKind::BailOnStackArgsOutOfActualsRange)"
                         ,
                         "instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutKind::BailOnStackArgsOutOfActualsRange"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    GenerateBailOut(this,instr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  }
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLdElemI(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool isHelper)
{
    IR::Instr *instrPrev = instr->m_prev;

    if(instr->IsJitProfilingInstr())
    {
        Assert(helperMethod == IR::HelperOp_GetElementI);
        Assert(!isHelper);
        LowerProfiledLdElemI(instr->AsJitProfilingInstr());
        return instrPrev;
    }

    if (!isHelper && instr->DoStackArgsOpt())
    {
        IR::LabelInstr * labelLdElem = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
        // Pass in null for labelFallThru to only generate the LdHeapArgument call
        GenerateFastArgumentsLdElemI(instr, nullptr);
        instr->InsertBefore(labelLdElem);
        instr->UnlinkSrc1();
        instr->UnlinkDst();
        Assert(instr->HasBailOutInfo() && instr->GetBailOutKind() == IR::BailOutKind::BailOnStackArgsOutOfActualsRange);
        instr = GenerateBailOut(instr, nullptr, nullptr);
        return instrPrev;
    }

    IR::Opnd *src1 = instr->UnlinkSrc1();
    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd");
    IR::IndirOpnd *indirOpnd = src1->AsIndirOpnd();
    bool loadScriptContext = true;
    IRType dstType = instr->GetDst()->GetType();

    IR::Opnd *indexOpnd = indirOpnd->UnlinkIndexOpnd();
    if (indexOpnd && indexOpnd->GetType() != TyVar)
    {
        Assert(indexOpnd->GetType() == TyUint32 || indexOpnd->GetType() == TyInt32);
        switch (helperMethod)
        {
        case IR::HelperOp_GetElementI:

            if (indexOpnd->GetType() == TyUint32)
            {
                helperMethod =
                    dstType == TyVar ? IR::HelperOp_GetElementI_UInt32 :
                    dstType == TyInt32 ? IR::HelperOp_GetNativeIntElementI_UInt32 :
                    IR::HelperOp_GetNativeFloatElementI_UInt32;
            }
            else
            {
                helperMethod =
                    dstType == TyVar ? IR::HelperOp_GetElementI_Int32 :
                    dstType == TyInt32 ? IR::HelperOp_GetNativeIntElementI_Int32 :
                    IR::HelperOp_GetNativeFloatElementI_Int32;
            }
            break;

        case IR::HelperOp_GetMethodElement:

            Assert(dstType == TyVar);
            helperMethod = indexOpnd->GetType() == TyUint32?
                IR::HelperOp_GetMethodElement_UInt32 : IR::HelperOp_GetMethodElement_Int32;
            break;

        case IR::HelperOp_TypeofElem:

            Assert(dstType == TyVar);
            helperMethod = indexOpnd->GetType() == TyUint32?
                IR::HelperOp_TypeofElem_UInt32 : IR::HelperOp_TypeofElem_Int32;
            break;

        default:
            Assert(false);
        }
    }
    else
    {
        if (indexOpnd == nullptr)
        {
            // No index; the offset identifies the element.
            IntConstType offset = (IntConstType)src1->AsIndirOpnd()->GetOffset();
            indexOpnd = IR::AddrOpnd::NewFromNumber(offset, m_func);
        }

        if (dstType != TyVar)
        {
            loadScriptContext = false;
            helperMethod =
                dstType == TyInt32 ? IR::HelperOp_GetNativeIntElementI : IR::HelperOp_GetNativeFloatElementI;
        }
    }

    // Jitted loop bodies have volatile information about values created outside the loop, so don't update array creation site
    // profile data from jitted loop bodies
    if(!m_func->IsLoopBody())
    {
        const ValueType baseValueType(indirOpnd->GetBaseOpnd()->GetValueType());
        if( baseValueType.IsLikelyObject() &&
            baseValueType.GetObjectType() == ObjectType::Array &&
            !baseValueType.HasIntElements())
        {
            switch(helperMethod)
            {
                case IR::HelperOp_GetElementI:
                    helperMethod =
                        baseValueType.HasFloatElements()
                            ? IR::HelperOp_GetElementI_ExpectingNativeFloatArray
                            : IR::HelperOp_GetElementI_ExpectingVarArray;
                    break;

                case IR::HelperOp_GetElementI_UInt32:
                    helperMethod =
                        baseValueType.HasFloatElements()
                            ? IR::HelperOp_GetElementI_UInt32_ExpectingNativeFloatArray
                            : IR::HelperOp_GetElementI_UInt32_ExpectingVarArray;
                    break;

                case IR::HelperOp_GetElementI_Int32:
                    helperMethod =
                        baseValueType.HasFloatElements()
                            ? IR::HelperOp_GetElementI_Int32_ExpectingNativeFloatArray
                            : IR::HelperOp_GetElementI_Int32_ExpectingVarArray;
                    break;
            }
        }
    }

    if (loadScriptContext)
    {
        LoadScriptContext(instr);
    }

    m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::Opnd *baseOpnd = indirOpnd->UnlinkBaseOpnd();
    m_lowererMD.LoadHelperArgument(instr, baseOpnd);

    src1->Free(this->m_func);

    m_lowererMD.ChangeToHelperCall(instr, helperMethod, nullptr, nullptr, nullptr, isHelper);

    return instrPrev;
}